

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O2

Formula * __thiscall
Kernel::FormulaTransformer::applyQuantified(FormulaTransformer *this,Formula *f)

{
  pointer pcVar1;
  Connective CVar2;
  undefined4 uVar3;
  Formula *pFVar4;
  Formula *this_00;
  
  pFVar4 = apply(this,(Formula *)f[1]._label._M_string_length);
  if (pFVar4 != (Formula *)f[1]._label._M_string_length) {
    this_00 = (Formula *)QuantifiedFormula::operator_new(0x40);
    CVar2 = f[1]._connective;
    uVar3 = *(undefined4 *)&f[1].field_0x4;
    pcVar1 = f[1]._label._M_dataplus._M_p;
    Formula::Formula(this_00,f->_connective);
    this_00[1]._connective = CVar2;
    *(undefined4 *)&this_00[1].field_0x4 = uVar3;
    this_00[1]._label._M_dataplus._M_p = pcVar1;
    this_00[1]._label._M_string_length = (size_type)pFVar4;
    f = this_00;
  }
  return f;
}

Assistant:

Formula* FormulaTransformer::applyQuantified(Formula* f)
{
  Formula* newArg = apply(f->qarg());
  if(newArg==f->qarg()) {
    return f;
  }
  // 0 is for the sorts list
  return new QuantifiedFormula(f->connective(), f->vars(),f->sorts(), newArg);
}